

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O2

bool so_5::impl::map_based_subscr_storage::(anonymous_namespace)::
     is_known_mbox_msg_pair<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>,std::_Rb_tree_iterator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
               (map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
                *s,_Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                   it)

{
  bool bVar1;
  long lVar2;
  undefined1 *puVar3;
  is_same_mbox_msg predicate;
  undefined8 local_20;
  _Base_ptr *local_18;
  
  local_20 = *(undefined8 *)(it._M_node + 1);
  local_18 = &it._M_node[1]._M_parent;
  if ((s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left != it._M_node) {
    lVar2 = std::_Rb_tree_decrement(it._M_node);
    bVar1 = is_same_mbox_msg::operator()((is_same_mbox_msg *)&local_20,(key_t *)(lVar2 + 0x20));
    if (bVar1) {
      return true;
    }
  }
  puVar3 = (undefined1 *)std::_Rb_tree_increment(it._M_node);
  if ((_Rb_tree_header *)puVar3 == &(s->_M_t)._M_impl.super__Rb_tree_header) {
    bVar1 = false;
  }
  else {
    bVar1 = is_same_mbox_msg::operator()((is_same_mbox_msg *)&local_20,(key_t *)(puVar3 + 0x20));
  }
  return bVar1;
}

Assistant:

bool is_known_mbox_msg_pair( M & s, IT it )
		{
			const is_same_mbox_msg predicate{
					it->first.m_mbox_id, it->first.m_msg_type };

			if( it != s.begin() )
				{
					IT prev = it;
					--prev;
					if( predicate( prev->first ) )
						return true;
				}

			IT next = it;
			++next;
			if( next != s.end() )
				return predicate( next->first );

			return false;
		}